

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<kj::ArrayPtr<const_char>_>::~Array(Array<kj::ArrayPtr<const_char>_> *this)

{
  Array<kj::ArrayPtr<const_char>_> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }